

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O1

Vec3f __thiscall TRM::Model::normal(Model *this,Vec2f uvf)

{
  int iVar1;
  uchar auVar2 [4];
  TGAColor TVar3;
  int i;
  long lVar4;
  TGAImage *this_00;
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *paVar5;
  float fVar6;
  undefined4 in_XMM0_Dc;
  undefined4 in_XMM0_Dd;
  Vec3f VVar7;
  TGAColor c;
  uchar local_40 [3] [4];
  anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 local_34;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  local_28._8_4_ = in_XMM0_Dc;
  local_28._0_8_ = uvf;
  local_28._12_4_ = in_XMM0_Dd;
  this_00 = &this->normalmap_;
  iVar1 = TGAImage::get_width(this_00);
  fVar6 = (float)iVar1 * (float)local_28._0_4_;
  local_28._0_4_ = local_28._4_4_;
  local_28._8_4_ = local_28._4_4_;
  local_28._12_4_ = local_28._4_4_;
  iVar1 = TGAImage::get_height(this_00);
  TVar3 = TGAImage::get(this_00,(int)fVar6,(int)((float)iVar1 * (float)local_28._0_4_));
  auVar2 = TVar3.bgra;
  local_40[0][0] = auVar2[0];
  local_40[0][1] = auVar2[1];
  local_40[0][2] = auVar2[2];
  local_40[0][3] = auVar2[3];
  lVar4 = 0;
  do {
    fVar6 = (float)local_40[0][lVar4] / 255.0;
    paVar5 = &local_34;
    if (((int)lVar4 != 0) &&
       (paVar5 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)&local_30,
       (int)lVar4 == 1)) {
      paVar5 = (anon_union_4_3_4e909dac_for_vec<3,_float,_(glm::qualifier)0>_7 *)
               ((long)&local_30 + 4);
    }
    paVar5->z = fVar6 + fVar6 + -1.0;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  VVar7.field_2 = local_34;
  VVar7.field_0 =
       (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(undefined4)local_30;
  VVar7.field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)local_30._4_4_;
  return VVar7;
}

Assistant:

Vec3f Model::normal(Vec2f uvf) {
  Vec2i uv;
  uv[0] = uvf[0] * normalmap_.get_width();
  uv[1] = uvf[1] * normalmap_.get_height();
  TGAColor c = normalmap_.get(uv[0], uv[1]);
  Vec3f res;
  for (int i = 0; i < 3; i++) res[2 - i] = (float)c[i] / 255.f * 2.f - 1.f;
  return res;
}